

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-amiga.cc
# Opt level: O0

PSprite __thiscall
DataSourceAmiga::get_game_object_sprite(DataSourceAmiga *this,size_t catalog,size_t index)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  uchar compression_00;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uchar filling_00;
  element_type *peVar5;
  element_type *peVar6;
  PBuffer *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  PSprite PVar7;
  undefined4 in_stack_fffffffffffffecc;
  shared_ptr<Data::Sprite> local_c8;
  undefined1 local_b8 [8];
  PSpriteAmiga sprite;
  undefined1 local_98 [8];
  PSpriteAmiga pixels;
  undefined1 local_78 [8];
  PSpriteAmiga mask;
  int width;
  uint8_t compression;
  uint8_t filling;
  uint8_t offset_x;
  uint8_t w;
  uint8_t offset_y;
  uint8_t h;
  shared_ptr<Buffer> local_48;
  undefined1 local_38 [8];
  PBuffer data;
  size_t index_local;
  size_t catalog_local;
  DataSourceAmiga *this_local;
  
  std::shared_ptr<Buffer>::shared_ptr(&local_48,(shared_ptr<Buffer> *)(catalog + 0x58));
  get_data_from_catalog((DataSourceAmiga *)local_38,catalog,index,in_RCX);
  std::shared_ptr<Buffer>::~shared_ptr(&local_48);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_38);
  if (bVar1) {
    peVar5 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_38);
    compression_00 = Buffer::pop<unsigned_char>(peVar5);
    peVar5 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_38);
    bVar2 = Buffer::pop<unsigned_char>(peVar5);
    peVar5 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_38);
    width._1_1_ = Buffer::pop<unsigned_char>(peVar5);
    peVar5 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_38);
    bVar3 = Buffer::pop<unsigned_char>(peVar5);
    peVar5 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_38);
    bVar4 = Buffer::pop<unsigned_char>(peVar5);
    peVar5 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_38);
    filling_00 = Buffer::pop<unsigned_char>(peVar5);
    if (width._1_1_ < 0x10) {
      width._1_1_ = 0x10;
    }
    mask.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._4_4_ = width._1_1_ + 7 >> 3;
    this_00 = &pixels.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount;
    std::shared_ptr<Buffer>::shared_ptr
              ((shared_ptr<Buffer> *)this_00,(shared_ptr<Buffer> *)local_38);
    decode_mask_sprite((DataSourceAmiga *)local_78,(PBuffer *)catalog,(size_t)this_00,
                       (long)(int)(mask.
                                   super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi._4_4_ << 3));
    std::shared_ptr<Buffer>::~shared_ptr
              ((shared_ptr<Buffer> *)
               &pixels.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_38);
    Buffer::pop_tail((Buffer *)
                     &sprite.
                      super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
    decode_planned_sprite
              ((DataSourceAmiga *)local_98,(PBuffer *)catalog,
               (size_t)&sprite.
                        super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount,
               (long)(int)mask.
                          super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi._4_4_,compression_00,filling_00,
               (uint8_t *)CONCAT44(in_stack_fffffffffffffecc,(uint)bVar4),true);
    std::shared_ptr<Buffer>::~shared_ptr
              ((shared_ptr<Buffer> *)
               &sprite.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    peVar6 = std::
             __shared_ptr_access<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_98);
    std::shared_ptr<Data::Sprite>::shared_ptr<DataSourceAmiga::SpriteAmiga,void>
              (&local_c8,(shared_ptr<DataSourceAmiga::SpriteAmiga> *)local_78);
    SpriteAmiga::get_amiga_masked((SpriteAmiga *)local_b8,(PSprite *)peVar6);
    std::shared_ptr<Data::Sprite>::~shared_ptr(&local_c8);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_b8);
    if (bVar1) {
      peVar6 = std::
               __shared_ptr_access<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_b8);
      SpriteAmiga::set_delta(peVar6,1,0);
      peVar6 = std::
               __shared_ptr_access<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_b8);
      SpriteAmiga::set_offset(peVar6,-(uint)bVar3,-(uint)bVar2);
      std::shared_ptr<Data::Sprite>::shared_ptr<DataSourceAmiga::SpriteAmiga,void>
                ((shared_ptr<Data::Sprite> *)this,
                 (shared_ptr<DataSourceAmiga::SpriteAmiga> *)local_b8);
    }
    else {
      std::shared_ptr<Data::Sprite>::shared_ptr((shared_ptr<Data::Sprite> *)this,(nullptr_t)0x0);
    }
    std::shared_ptr<DataSourceAmiga::SpriteAmiga>::~shared_ptr
              ((shared_ptr<DataSourceAmiga::SpriteAmiga> *)local_b8);
    std::shared_ptr<DataSourceAmiga::SpriteAmiga>::~shared_ptr
              ((shared_ptr<DataSourceAmiga::SpriteAmiga> *)local_98);
    std::shared_ptr<DataSourceAmiga::SpriteAmiga>::~shared_ptr
              ((shared_ptr<DataSourceAmiga::SpriteAmiga> *)local_78);
  }
  else {
    std::shared_ptr<Data::Sprite>::shared_ptr((shared_ptr<Data::Sprite> *)this,(nullptr_t)0x0);
  }
  std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)local_38);
  PVar7.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar7.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (PSprite)PVar7.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Data::PSprite
DataSourceAmiga::get_game_object_sprite(size_t catalog, size_t index) {
  PBuffer data = get_data_from_catalog(catalog, index, gfxchip);
  if (!data) {
    return nullptr;
  }

  uint8_t h = data->pop<uint8_t>();
  uint8_t offset_y = data->pop<uint8_t>();
  uint8_t w = data->pop<uint8_t>();
  uint8_t offset_x = data->pop<uint8_t>();
  uint8_t filling = data->pop<uint8_t>();
  uint8_t compression = data->pop<uint8_t>();

  if (w < 16) w = 16;

  int width = (w+7)/8;

  PSpriteAmiga mask = decode_mask_sprite(data, width*8, h);
  PSpriteAmiga pixels = decode_planned_sprite(data->pop_tail(), width, h,
                                              compression, filling, palette);

  PSpriteAmiga sprite = pixels->get_amiga_masked(mask);
  if (!sprite) {
    return nullptr;
  }
  sprite->set_delta(1, 0);
  sprite->set_offset(-offset_x, -offset_y);

  return sprite;
}